

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  int iVar1;
  Value n;
  TValue *i_o;
  Value local_28;
  undefined4 local_20;
  
  n.gc = (GCObject *)str_checkname(ls);
  fs = ls->fs;
  iVar1 = singlevaraux(fs,(TString *)n.gc,var,1);
  if (iVar1 == 8) {
    local_20 = 4;
    local_28.gc = n.gc;
    iVar1 = addk(fs,(TValue *)&local_28,(TValue *)&local_28);
    (var->u).s.info = iVar1;
  }
  return;
}

Assistant:

static void singlevar(LexState*ls,expdesc*var){
TString*varname=str_checkname(ls);
FuncState*fs=ls->fs;
if(singlevaraux(fs,varname,var,1)==VGLOBAL)
var->u.s.info=luaK_stringK(fs,varname);
}